

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_test.c
# Opt level: O2

void test_msg_clear_body(void)

{
  nng_err nVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  nng_msg *local_20;
  nng_msg *msg;
  
  nVar1 = nng_msg_alloc(&local_20,0);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/message_test.c"
                         ,0x8d,"%s: expected success, got %s (%d)","nng_msg_alloc(&msg, 0)",pcVar3,
                         nVar1);
  if (iVar2 != 0) {
    nVar1 = nng_msg_header_append(local_20,"header",7);
    pcVar3 = nng_strerror(nVar1);
    iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/message_test.c"
                           ,0x8e,"%s: expected success, got %s (%d)",
                           "nng_msg_header_append(msg, \"header\", 7)",pcVar3,nVar1);
    if (iVar2 != 0) {
      nVar1 = nng_msg_append(local_20,"body",5);
      pcVar3 = nng_strerror(nVar1);
      iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/message_test.c"
                             ,0x8f,"%s: expected success, got %s (%d)",
                             "nng_msg_append(msg, \"body\", 5)",pcVar3,nVar1);
      if (iVar2 != 0) {
        sVar4 = nng_msg_header_len(local_20);
        iVar2 = acutest_check_((uint)(sVar4 == 7),
                               "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/message_test.c"
                               ,0x90,"%s","nng_msg_header_len(msg) == 7");
        if (iVar2 != 0) {
          sVar4 = nng_msg_len(local_20);
          iVar2 = acutest_check_((uint)(sVar4 == 5),
                                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/message_test.c"
                                 ,0x91,"%s","nng_msg_len(msg) == 5");
          if (iVar2 != 0) {
            nng_msg_clear(local_20);
            sVar4 = nng_msg_len(local_20);
            iVar2 = acutest_check_((uint)(sVar4 == 0),
                                   "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/message_test.c"
                                   ,0x93,"%s","nng_msg_len(msg) == 0");
            if (iVar2 != 0) {
              sVar4 = nng_msg_header_len(local_20);
              iVar2 = acutest_check_((uint)(sVar4 == 7),
                                     "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/message_test.c"
                                     ,0x94,"%s","nng_msg_header_len(msg) == 7");
              if (iVar2 != 0) {
                pcVar3 = (char *)nng_msg_header(local_20);
                iVar2 = strcmp(pcVar3,"header");
                iVar2 = acutest_check_((uint)(iVar2 == 0),
                                       "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/message_test.c"
                                       ,0x95,"%s","strcmp(nng_msg_header(msg), \"header\") == 0");
                if (iVar2 != 0) {
                  nng_msg_free(local_20);
                  return;
                }
              }
            }
          }
        }
      }
    }
  }
  acutest_abort_();
}

Assistant:

void
test_msg_clear_body(void)
{
	nng_msg *msg;
	NUTS_PASS(nng_msg_alloc(&msg, 0));
	NUTS_PASS(nng_msg_header_append(msg, "header", 7));
	NUTS_PASS(nng_msg_append(msg, "body", 5));
	NUTS_ASSERT(nng_msg_header_len(msg) == 7);
	NUTS_ASSERT(nng_msg_len(msg) == 5);
	nng_msg_clear(msg);
	NUTS_ASSERT(nng_msg_len(msg) == 0);
	NUTS_ASSERT(nng_msg_header_len(msg) == 7);
	NUTS_ASSERT(strcmp(nng_msg_header(msg), "header") == 0);

	nng_msg_free(msg);
}